

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_buf.c
# Opt level: O3

ngx_chain_t * ngx_chain_update_sent(ngx_chain_t *in,off_t sent)

{
  ushort uVar1;
  ngx_buf_t *pnVar2;
  long lVar3;
  
  if (in == (ngx_chain_t *)0x0) {
    return (ngx_chain_t *)0x0;
  }
  do {
    pnVar2 = in->buf;
    uVar1 = *(ushort *)&pnVar2->field_0x48;
    if ((uVar1 & 0xe0) == 0 || (uVar1 & 0x17) != 0) {
      if (sent == 0) {
        return in;
      }
      if ((uVar1 & 7) == 0) {
        lVar3 = pnVar2->file_last - pnVar2->file_pos;
        if (sent < lVar3) goto LAB_00115f31;
      }
      else {
        lVar3 = (long)pnVar2->last - (long)pnVar2->pos;
        if (sent < lVar3) {
          pnVar2->pos = pnVar2->pos + sent;
LAB_00115f31:
          if ((uVar1 & 0x10) == 0) {
            return in;
          }
          pnVar2->file_pos = pnVar2->file_pos + sent;
          return in;
        }
        pnVar2->pos = pnVar2->last;
      }
      sent = sent - lVar3;
      if ((uVar1 & 0x10) != 0) {
        pnVar2->file_pos = pnVar2->file_last;
      }
    }
    in = in->next;
    if (in == (ngx_chain_t *)0x0) {
      return (ngx_chain_t *)0x0;
    }
  } while( true );
}

Assistant:

ngx_chain_t *
ngx_chain_update_sent(ngx_chain_t *in, off_t sent)
{
    off_t  size;

    for ( /* void */ ; in; in = in->next) {

        if (ngx_buf_special(in->buf)) {
            continue;
        }

        if (sent == 0) {
            break;
        }

        size = ngx_buf_size(in->buf);

        if (sent >= size) {
            sent -= size;

            if (ngx_buf_in_memory(in->buf)) {
                in->buf->pos = in->buf->last;
            }

            if (in->buf->in_file) {
                in->buf->file_pos = in->buf->file_last;
            }

            continue;
        }

        if (ngx_buf_in_memory(in->buf)) {
            in->buf->pos += (size_t) sent;
        }

        if (in->buf->in_file) {
            in->buf->file_pos += sent;
        }

        break;
    }

    return in;
}